

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O3

void searchlight_plot(tgestate_t *state,attribute_t *attrs,int clip_left)

{
  zxspectrum_t *pzVar1;
  byte bVar2;
  long lVar3;
  long lVar4;
  byte *pbVar5;
  byte *pbVar6;
  byte *pbVar7;
  int iVar8;
  attribute_t *paVar9;
  long lVar10;
  long lVar11;
  char cVar12;
  attribute_t *paVar13;
  byte bVar14;
  byte bVar15;
  bool bVar16;
  
  pzVar1 = state->speccy;
  iVar8 = state->width;
  paVar9 = (pzVar1->screen).attributes;
  cVar12 = '\x10';
  bVar15 = 0;
  pbVar5 = "";
  do {
    lVar11 = (long)iVar8;
    lVar3 = ((long)attrs - (long)paVar9) % lVar11;
    if (paVar9 + (int)(((0x15 < lVar3 && clip_left != 0) | 0x12) * iVar8) <= attrs) break;
    pbVar7 = pbVar5 + 2;
    if (paVar9 + (iVar8 << (lVar3 < 7 || clip_left == 0)) <= attrs) {
      lVar3 = 2;
      pbVar6 = pbVar5;
      paVar13 = attrs;
      do {
        bVar2 = *pbVar6;
        lVar10 = 0;
        bVar14 = bVar15;
        do {
          iVar8 = state->width;
          lVar11 = (long)iVar8;
          lVar4 = (long)(paVar13 + lVar10 + (-0x1830 - (long)pzVar1)) % lVar11;
          if (clip_left == 0) {
            if (0x1d < lVar4) {
              pbVar7 = pbVar6 + lVar3;
              bVar15 = bVar14;
              goto LAB_00108e40;
            }
            if (lVar4 < 7) goto LAB_00108dc5;
LAB_00108dda:
            if ((char)bVar2 < '\0') {
              paVar13[lVar10] = '\x06';
              bVar15 = 1;
            }
            else {
              paVar13[lVar10] = 'A';
              bVar15 = 0;
            }
          }
          else {
            if (0xfffffffffffffff0 < lVar4 - 0x16U) goto LAB_00108dda;
LAB_00108dc5:
            bVar15 = bVar2 >> 7;
          }
          bVar2 = bVar2 * '\x02' | bVar14;
          lVar10 = lVar10 + 1;
          bVar14 = bVar15;
        } while ((char)lVar10 != '\b');
        paVar13 = paVar13 + lVar10;
        lVar3 = 1;
        bVar16 = pbVar6 != pbVar5 + 1;
        pbVar6 = pbVar6 + 1;
      } while (bVar16);
      iVar8 = state->width;
      lVar11 = (long)iVar8;
    }
LAB_00108e40:
    attrs = attrs + lVar11;
    cVar12 = cVar12 + -1;
    pbVar5 = pbVar7;
  } while (cVar12 != '\0');
  (*state->speccy->draw)(state->speccy,&searchlight_plot::dirty);
  return;
}

Assistant:

void searchlight_plot(tgestate_t  *state,
                      attribute_t *attrs,
                      int          clip_left)
{
  /**
   * $AF3E: Searchlight circle shape.
   */
  static const uint8_t searchlight_shape[2 * 16] =
  {
    ________,________,
    ________,________,
    ________,________,
    _______X,X_______,
    _____XXX,XXX_____,
    ____XXXX,XXXX____,
    ____XXXX,XXXX____,
    ___XXXXX,XXXXX___,
    ___XXXXX,XXXXX___,
    ____XXXX,XXXX____,
    ____XXXX,XXXX____,
    _____XXX,XXX_____,
    _______X,X_______,
    ________,________,
    ________,________,
    ________,________
  };

  /* We can't ASSERT_SCREEN_ATTRIBUTES_PTR_VALID(attrs) here as expected as
   * the attrs pointer can be out of bounds... */

  attribute_t *const attrs_base = &state->speccy->screen.attributes[0];
  ASSERT_SCREEN_ATTRIBUTES_PTR_VALID(attrs_base);

{
  const uint8_t *shape;       /* was DE' */
  uint8_t        iters;       /* was C' */
  ptrdiff_t      x;           /* was A */
  attribute_t   *max_y_attrs; /* was HL */
  attribute_t   *saved_attrs; /* was stack */
  attribute_t   *min_y_attrs; /* was HL */
  uint8_t        iters2;      /* was B' */
  int            carry = 0;   /* added */

  /* Screen coords are x = 0..31, y = 0..23.
   * Game window occupies attribute rows 2..17 and columns 7..29 (inclusive).
   * Attribute row 18 is the row beyond the bottom edge of the game window.
   */

  // Conv: clip_left code was made a parameter, code handling it is hoisted.

  shape = &searchlight_shape[0];
  iters = 16; /* height */
  do
  {
    x = (attrs - attrs_base) % state->width; // Conv: was '& 31'. hoisted.

    // Finish if we're beyond the maximum y

    max_y_attrs = &attrs_base[18 * state->width]; // was HL = 0x5A40; // screen attribute address (column 0 + bottom of game screen)
    if (clip_left)
    {
      // BUG: This chunk seems to do nothing useful but allow the bottom
      // border to be overwritten. FUTURE: Remove.
      // Conv: was: if ((E & 31) >= 22) L = 32;
      if (x >= 22) // 22 => 8 attrs away from the edge maybe?
        max_y_attrs = &attrs_base[19 * state->width]; // row 19, column 0
    }
    if (attrs >= max_y_attrs) // gone off the end of the game screen?
      /* Conv: Original code just returned, instead goto exit so I can force
       * a screen refresh down there. */
      goto exit;

    saved_attrs = attrs; // PUSH DE

    // Clip/skip rows until we're in bounds

    min_y_attrs = &attrs_base[2 * state->width]; // screen attribute address (row 2, column 0)
    if (clip_left)
    {
      // BUG: Again, this chunk seems to do nothing useful but allow the
      // bottom border to be overwritten. FUTURE: Remove.
      // Conv: was: if (E & 31) >= 7) L = 32;
      if (x >= 7)
        min_y_attrs = &attrs_base[1 * state->width]; // row 1, column 0
    }
    if (attrs < min_y_attrs)
    {
      shape += 2;
      goto next_row;
    }

    iters2 = 2; /* iterations - rowbytes */
    do
    {
      uint8_t iters3; /* was B */
      uint8_t pixels; /* was C */

      pixels = *shape; // Conv: Original uses A as temporary.

      iters3 = 8; /* iterations - bits per byte */
      do
      {
        x = (attrs - attrs_base) % state->width;  // Conv: was '& 31'. was interleaved; '& 31's hoisted from below

        /* clip right hand edge */

        // i don't presently see any evidence that this chunk affects anything in the game, bcbw
        // does this stop us sliding into the next scanline of data?
        if (clip_left)
        {
          if (x >= 22)
            goto dont_plot; // this doesn't skip the whole remainder of the row unlike the case below
        }
        else
        {
          if (x >= 30) // Conv: Constant 30 was in E
          {
            shape += iters2; /* Conv: Was a loop. */
            goto next_row; // skip whole row
          }
        }

        /* clip left hand edge */

        if (x < 7) // Conv: Constant 7 was in D
        {
          /* Don't render leftwards of the game window */
dont_plot:
          RL(pixels); // no plot
        }
        else
        {
          // plot
          RL(pixels);
          if (carry)
            *attrs = attribute_YELLOW_OVER_BLACK;
          else
            *attrs = attribute_BRIGHT_BLUE_OVER_BLACK;
        }
        attrs++;
      }
      while (--iters3);

      shape++;
    }
    while (--iters2);

next_row:
    attrs = saved_attrs + state->width;
  }
  while (--iters);

exit:
  {
    /* FUTURE: Make the dirty rectangle more accurate. */
    static const zxbox_t dirty = { 7 * 8, 2 * 8, 29 * 8, 17 * 8 };
    state->speccy->draw(state->speccy, &dirty);
  }
}
}